

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O1

vec3f __thiscall Triangle::Ns(Triangle *this,point *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  vec3f vVar22;
  
  fVar10 = (this->vn3).z;
  fVar21 = (this->vn1).z;
  fVar20 = (this->v1).x;
  fVar9 = (this->v1).y;
  fVar11 = p->x - fVar20;
  fVar15 = p->y - fVar9;
  fVar19 = (this->v1).z;
  fVar13 = p->z - fVar19;
  fVar20 = (this->v2).x - fVar20;
  fVar9 = (this->v2).y - fVar9;
  fVar19 = (this->v2).z - fVar19;
  fVar16 = fVar15 * fVar19 - fVar9 * fVar13;
  fVar19 = fVar13 * fVar20 - fVar19 * fVar11;
  fVar20 = fVar9 * fVar11 - fVar20 * fVar15;
  fVar20 = fVar20 * fVar20 + fVar16 * fVar16 + fVar19 * fVar19;
  uVar1 = (this->vn3).x;
  uVar5 = (this->vn3).y;
  uVar2 = (this->vn1).x;
  uVar6 = (this->vn1).y;
  if (fVar20 < 0.0) {
    fVar20 = sqrtf(fVar20);
  }
  else {
    fVar20 = SQRT(fVar20);
  }
  fVar9 = this->one_by_2S;
  uVar3 = (this->vn1).x;
  uVar7 = (this->vn1).y;
  fVar19 = (this->vn1).z;
  uVar4 = (this->vn2).x;
  uVar8 = (this->vn2).y;
  fVar11 = (this->vn2).z;
  fVar13 = (this->v1).x;
  fVar15 = (this->v1).y;
  fVar12 = p->x - fVar13;
  fVar17 = p->y - fVar15;
  fVar16 = (this->v1).z;
  fVar14 = p->z - fVar16;
  fVar13 = (this->v3).x - fVar13;
  fVar15 = (this->v3).y - fVar15;
  fVar16 = (this->v3).z - fVar16;
  fVar18 = fVar17 * fVar16 - fVar15 * fVar14;
  fVar16 = fVar14 * fVar13 - fVar16 * fVar12;
  fVar13 = fVar15 * fVar12 - fVar13 * fVar17;
  fVar13 = fVar13 * fVar13 + fVar18 * fVar18 + fVar16 * fVar16;
  if (fVar13 < 0.0) {
    fVar13 = sqrtf(fVar13);
  }
  else {
    fVar13 = SQRT(fVar13);
  }
  fVar15 = this->one_by_2S;
  fVar16 = fVar9 * ((float)uVar1 - (float)uVar2) * fVar20 + (float)uVar3 +
           fVar15 * ((float)uVar4 - (float)uVar3) * fVar13;
  fVar12 = fVar9 * ((float)uVar5 - (float)uVar6) * fVar20 + (float)uVar7 +
           fVar15 * ((float)uVar8 - (float)uVar7) * fVar13;
  fVar21 = (fVar10 - fVar21) * fVar20 * fVar9 + fVar19 + (fVar11 - fVar19) * fVar13 * fVar15;
  fVar10 = fVar21 * fVar21 + fVar16 * fVar16 + fVar12 * fVar12;
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  fVar10 = 1.0 / fVar10;
  vVar22.x = fVar10 * fVar16;
  vVar22.y = fVar10 * fVar12;
  vVar22.z = fVar10 * fVar21;
  return vVar22;
}

Assistant:

vec3f Ns(const point& p) const
	{
		assert(onsurface(p));
		return normalized(
			vn1 + (vn3-vn1) * norm(cross(p-v1, v2-v1)) * one_by_2S
				+ (vn2-vn1) * norm(cross(p-v1, v3-v1)) * one_by_2S); // TO OPTIMIZE
	}